

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

string * __thiscall
re2::DFA::DumpState_abi_cxx11_(string *__return_storage_ptr__,DFA *this,State *state)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (this == (DFA *)0x2) {
    pcVar2 = "*";
    pcVar1 = "";
  }
  else if (this == (DFA *)0x1) {
    pcVar2 = "X";
    pcVar1 = "";
  }
  else {
    if (this != (DFA *)0x0) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      StringAppendF(__return_storage_ptr__,"(%p)",this);
      if (0 < (int)this->kind_) {
        lVar3 = 0;
        pcVar1 = "";
        do {
          if (this->prog_->inst_count_[lVar3 + -10] == -1) {
            StringAppendF(__return_storage_ptr__,"|",pcVar1);
            pcVar1 = "";
          }
          else {
            StringAppendF(__return_storage_ptr__,"%s%d",pcVar1);
            pcVar1 = ",";
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < (int)this->kind_);
      }
      StringAppendF(__return_storage_ptr__," flag=%#x",(ulong)*(uint *)&this->init_failed_);
      return __return_storage_ptr__;
    }
    pcVar2 = "_";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string DFA::DumpState(State* state) {
  if (state == NULL)
    return "_";
  if (state == DeadState)
    return "X";
  if (state == FullMatchState)
    return "*";
  string s;
  const char* sep = "";
  StringAppendF(&s, "(%p)", state);
  for (int i = 0; i < state->ninst_; i++) {
    if (state->inst_[i] == Mark) {
      StringAppendF(&s, "|");
      sep = "";
    } else {
      StringAppendF(&s, "%s%d", sep, state->inst_[i]);
      sep = ",";
    }
  }
  StringAppendF(&s, " flag=%#x", state->flag_);
  return s;
}